

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void vkt::Draw::createDrawTests(TestCaseGroup *testGroup)

{
  TestCaseGroup *parent;
  char *__s;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  DrawCommandType local_18;
  DrawCommandType local_14;
  DrawCommandType command;
  deUint32 idx;
  TestCaseGroup *testGroup_local;
  
  _command = testGroup;
  for (local_14 = DRAW_COMMAND_TYPE_DRAW; parent = _command, local_14 < DRAW_COMMAND_TYPE_DRAW_LAST;
      local_14 = local_14 + DRAW_COMMAND_TYPE_DRAW_INDEXED) {
    local_18 = local_14;
    __s = anon_unknown_0::getDrawCommandTypeName(local_14);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Group for testing a specific draw command.",&local_71);
    addTestGroup<vkt::Draw::(anonymous_namespace)::DrawCommandType>
              (parent,&local_38,&local_70,createTopologyGroups,local_18);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

void createDrawTests (tcu::TestCaseGroup* testGroup)
{
	for (deUint32 idx = 0; idx < DRAW_COMMAND_TYPE_DRAW_LAST; ++idx)
	{
		const DrawCommandType	command	= DrawCommandType(idx);
		addTestGroup(testGroup, getDrawCommandTypeName(command), "Group for testing a specific draw command.", createTopologyGroups, command);
	}
}